

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O1

void __thiscall VmaBlockMetadata_TLSF::RemoveFreeBlock(VmaBlockMetadata_TLSF *this,Block *block)

{
  uint32_t *puVar1;
  ulong uVar2;
  long lVar3;
  byte bVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  byte bVar8;
  
  if ((block->field_5).nextFree != (Block *)0x0) {
    ((block->field_5).nextFree)->prevFree = block->prevFree;
  }
  if (block->prevFree == (Block *)0x0) {
    uVar2 = block->size;
    lVar3 = 0x3f;
    if (uVar2 != 0) {
      for (; uVar2 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    bVar8 = 0x38 - ((byte)lVar3 ^ 0x3f);
    if (uVar2 < 0x101) {
      bVar8 = 0;
    }
    if (bVar8 == 0) {
      if ((this->super_VmaBlockMetadata).m_IsVirtual == true) {
        uVar5 = (int)uVar2 - 1U >> 3;
      }
      else {
        uVar5 = (int)uVar2 - 1U >> 6;
      }
    }
    else {
      uVar5 = (uint)(uVar2 >> (bVar8 + 2 & 0x3f)) ^ 0x20;
    }
    if (bVar8 == 0) {
      uVar7 = uVar5 & 0xffff;
    }
    else {
      iVar6 = (uint)bVar8 * 0x20;
      uVar7 = (iVar6 + (uVar5 & 0xffff)) - 0x1c;
      if ((this->super_VmaBlockMetadata).m_IsVirtual != false) {
        uVar7 = iVar6 + (uVar5 & 0xffff);
      }
    }
    *(anon_union_8_2_34c73d97_for_Block_5 *)(this->m_FreeList + uVar7) = block->field_5;
    if ((block->field_5).nextFree == (Block *)0x0) {
      bVar4 = (byte)uVar5 & 0x1f;
      puVar1 = this->m_InnerIsFreeBitmap + (uint)bVar8;
      *puVar1 = *puVar1 & (-2 << bVar4 | 0xfffffffeU >> 0x20 - bVar4);
      if (*puVar1 == 0) {
        this->m_IsFreeBitmap = this->m_IsFreeBitmap & ~(uint)(1L << (bVar8 & 0x3f));
      }
    }
  }
  else {
    block->prevFree->field_5 = block->field_5;
  }
  block->prevFree = block;
  (block->field_5).nextFree = (Block *)0x0;
  this->m_BlocksFreeCount = this->m_BlocksFreeCount - 1;
  this->m_BlocksFreeSize = this->m_BlocksFreeSize - block->size;
  return;
}

Assistant:

void VmaBlockMetadata_TLSF::RemoveFreeBlock(Block* block)
{
    VMA_ASSERT(block != m_NullBlock);
    VMA_ASSERT(block->IsFree());

    if (block->NextFree() != VMA_NULL)
        block->NextFree()->PrevFree() = block->PrevFree();
    if (block->PrevFree() != VMA_NULL)
        block->PrevFree()->NextFree() = block->NextFree();
    else
    {
        uint8_t memClass = SizeToMemoryClass(block->size);
        uint16_t secondIndex = SizeToSecondIndex(block->size, memClass);
        uint32_t index = GetListIndex(memClass, secondIndex);
        VMA_ASSERT(m_FreeList[index] == block);
        m_FreeList[index] = block->NextFree();
        if (block->NextFree() == VMA_NULL)
        {
            m_InnerIsFreeBitmap[memClass] &= ~(1U << secondIndex);
            if (m_InnerIsFreeBitmap[memClass] == 0)
                m_IsFreeBitmap &= ~(1UL << memClass);
        }
    }
    block->MarkTaken();
    block->UserData() = VMA_NULL;
    --m_BlocksFreeCount;
    m_BlocksFreeSize -= block->size;
}